

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetNextWindowSize(ImVec2 *size,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if ((cond & cond - 1U) == 0) {
    (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
    (pIVar1->NextWindowData).SizeVal = *size;
    (pIVar1->NextWindowData).SizeCond = cond + (uint)(cond == 0);
    return;
  }
  __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x1a7c,"void ImGui::SetNextWindowSize(const ImVec2 &, ImGuiCond)");
}

Assistant:

void ImGui::SetNextWindowSize(const ImVec2& size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSize;
    g.NextWindowData.SizeVal = size;
    g.NextWindowData.SizeCond = cond ? cond : ImGuiCond_Always;
}